

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareOffsets_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  TestError *this_00;
  long lVar2;
  bool bVar3;
  allocator<char> local_39;
  size_t position;
  
  lVar2 = test_case->m_source_texture_target_index * 0x30;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"TYPE(VAL_LIST)",&local_39);
  if (*(long *)(texture_targets + lVar2 + 0x10) - 1U < 4) {
    position = 0;
    Utils::replaceToken("TYPE",&position,
                        *(GLchar **)(&DAT_01dba300 + *(long *)(texture_targets + lVar2 + 0x10) * 8),
                        __return_storage_ptr__);
    lVar2 = *(long *)(texture_targets + lVar2 + 8);
    while (sVar1 = position, bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      Utils::replaceToken("VAL_LIST",&position,"0, VAL_LIST",__return_storage_ptr__);
      position = sVar1 + 1;
    }
    Utils::replaceToken(", VAL_LIST",&position,"",__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid value",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
             ,0xd32);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string SmokeTest::prepareOffsets(const testCase& test_case)
{
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	const glw::GLchar* type = DE_NULL;

	std::string offsets = "TYPE(VAL_LIST)";

	switch (target.m_n_derivatives)
	{
	case 1:
		type = "int";
		break;
	case 2:
		type = "ivec2";
		break;
	case 3:
		type = "ivec3";
		break;
	case 4:
		type = "ivec4";
		break;
	default:
		TCU_FAIL("Invalid value");
		break;
	}

	size_t position = 0;

	Utils::replaceToken("TYPE", position, type, offsets);

	for (size_t i = 0; i < target.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", offsets);

		position = start_position + 1;
	}

	Utils::replaceToken(", VAL_LIST", position, "", offsets);

	return offsets;
}